

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineLimitTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LimitEllipsisTests::
GlyphIndexAndExtentAreLatchedForTheStyleAtWhichCandidatePositionIsFound(LimitEllipsisTests *this)

{
  allocator local_109;
  char *i;
  char *local_100;
  string local_f8;
  LocationInfo local_d8;
  state referenceTrimmed [1];
  pair<unsigned_long,_std::pair<unsigned_int,_float>_> reference [3];
  ellipsis e;
  layout_builder b;
  
  b.ellipsis_codepoint = 0x2026;
  b.ellipsis_symbol.first = 0x8b;
  b.ellipsis_symbol.second = 3.71;
  b.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b.state.extent = 0.0;
  b.state.next = 0;
  i = "foobar";
  e._limit = 50.0;
  e._symbol_codepoint = 0x2026;
  e._at.extent = 0.0;
  e._at.next = 0;
  b.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  e._symbol.first = 0;
  e._symbol.second = 0.0;
  e._at_symbol.first = 0;
  e._at_symbol.second = 0.0;
  e._stop = false;
  limit::ellipsis::begin_style<agge::tests::mocks::layout_builder>(&e,&b);
  b.state.extent = 45.29;
  b.state.next = 10;
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            (&e,&b,0x17,1.0,&i,"oobar","");
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            (&e,&b,0x18,1.0,&i,"obar","");
  b.ellipsis_symbol.first = 0x65;
  b.ellipsis_symbol.second = 2.9;
  limit::ellipsis::begin_style<agge::tests::mocks::layout_builder>(&e,&b);
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            (&e,&b,0x19,2.8,&i,"bar","");
  reference[0].first = 10;
  reference[0].second.first = 0x17;
  reference[0].second.second = 1.0;
  reference[1].first = 0xb;
  reference[1].second.first = 0x18;
  reference[1].second.second = 1.0;
  reference[2].first = 0xb;
  reference[2].second.first = 0x8b;
  reference[2].second.second = 3.71;
  referenceTrimmed[0].extent = 46.29;
  referenceTrimmed[0].next = 0xb;
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,(allocator *)&local_100);
  ut::LocationInfo::LocationInfo(&local_d8,&local_f8,0x152);
  ut::
  are_equal<std::pair<unsigned_long,std::pair<unsigned_int,float>>,3ul,std::vector<std::pair<unsigned_long,std::pair<unsigned_int,float>>,std::allocator<std::pair<unsigned_long,std::pair<unsigned_int,float>>>>>
            (&reference,&b.appended,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,(allocator *)&local_100);
  ut::LocationInfo::LocationInfo(&local_d8,&local_f8,0x153);
  ut::
  are_equal<agge::layout_builder::state,1ul,std::vector<agge::layout_builder::state,std::allocator<agge::layout_builder::state>>>
            (&referenceTrimmed,&b.trimmed_at,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  local_100 = "bar";
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_109);
  ut::LocationInfo::LocationInfo(&local_d8,&local_f8,0x154);
  ut::are_equal<char_const*,char_const*>(&local_100,&i,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  mocks::layout_builder::~layout_builder(&b);
  return;
}

Assistant:

test( GlyphIndexAndExtentAreLatchedForTheStyleAtWhichCandidatePositionIsFound )
			{
				// INIT
				mocks::layout_builder b;
				const char *const begin = "foobar", *const end = begin + 6;
				const char *i = begin;
				limit::ellipsis e(50.0f);

				e.begin_style(b);
				b.state.extent = 50.0f - 4.71f;
				b.state.next = 10;
				e.add_glyph(b, 23, 1.0f, i, begin + 1, end);
				// <- in here the ellipsis will be appended after the trimming
				e.add_glyph(b, 24, 1.0f, i, begin + 2, end);
				b.ellipsis_symbol.first = 101;
				b.ellipsis_symbol.second = 2.9f;
				e.begin_style(b);

				// ACT
				e.add_glyph(b, 25, 2.8f, i, begin + 3, end);

				// ASSERT
				pair<size_t, pair<glyph_index_t, real_t> > reference[] = {
					make_pair(10u, make_pair(23u, 1.0f)),
					make_pair(11u, make_pair(24u, 1.0f)),
					make_pair(11u, make_pair(139u, 3.71f)), // despite the last ellipsis was 101, 2.9f, we set the previous.
				};
				layout_builder::state referenceTrimmed[] = {	{	46.29f, 11u	}	};

				assert_equal(reference, b.appended);
				assert_equal(referenceTrimmed, b.trimmed_at);
				assert_equal(begin + 3, i);
			}